

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetch.hpp
# Opt level: O0

void boost::runtime::env::env_detail::
     fetch_absent<std::pair<boost::unit_test::basic_cstring<char_const>,bool>(*)(boost::unit_test::basic_cstring<char_const>)>
               (parameters_store *params,arguments_store *args,
               _func_pair<boost::unit_test::basic_cstring<const_char>,_bool>_basic_cstring<const_char>
               *read_func)

{
  static_any_base *psVar1;
  undefined8 uVar2;
  code *pcVar3;
  bool bVar4;
  storage_type *psVar5;
  storage_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  type pbVar7;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> *this;
  code *in_RDX;
  undefined8 in_RSI;
  parameters_store *in_RDI;
  pair<boost::unit_test::basic_cstring<const_char>,_bool> value;
  basic_param_ptr param;
  value_type *v;
  bool _fe_con_69;
  static_any_t _fe_end_69;
  static_any_t _fe_cur_69;
  shared_ptr<boost::runtime::basic_param> *in_stack_fffffffffffffdb8;
  sp_counted_base *in_stack_fffffffffffffdc0;
  std_string *in_stack_fffffffffffffdc8;
  type in_stack_fffffffffffffdd0;
  byte local_20a;
  sp_counted_base *in_stack_fffffffffffffe18;
  byte local_1c9;
  basic_cstring<const_char> local_1b0 [16];
  undefined1 local_b0 [16];
  basic_cstring<const_char> local_a0;
  byte local_90;
  undefined4 local_88;
  pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::basic_param>_>
  *local_50;
  byte local_44;
  _Rb_tree_const_iterator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::basic_param>_>_>
  local_40;
  static_any_base *local_38;
  undefined1 local_28 [16];
  code *local_18;
  undefined8 local_10;
  parameters_store *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  psVar5 = parameters_store::all(in_RDI);
  psVar6 = parameters_store::all(local_8);
  unit_test::for_each::
  is_const_coll<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>const>
            (psVar6);
  integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x27ccd6);
  local_28._0_8_ =
       unit_test::for_each::
       begin<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>>
                 (psVar5);
  local_28._8_8_ = local_28;
  bVar4 = unit_test::for_each::static_any_base::operator_cast_to_bool
                    ((static_any_base *)local_28._8_8_);
  if (!bVar4) {
    psVar5 = parameters_store::all(local_8);
    psVar6 = parameters_store::all(local_8);
    unit_test::for_each::
    is_const_coll<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>const>
              (psVar6);
    integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x27cd4a);
    local_40._M_node =
         (_Base_ptr)
         unit_test::for_each::
         end<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>>
                   (psVar5);
    local_38 = (static_any_base *)&local_40;
    bVar4 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_38);
    if (!bVar4) {
      local_44 = 1;
      while( true ) {
        psVar1 = local_38;
        local_1c9 = 0;
        if ((local_44 & 1) != 0) {
          in_stack_fffffffffffffe18 = (sp_counted_base *)local_28._8_8_;
          psVar5 = parameters_store::all(local_8);
          psVar6 = parameters_store::all(local_8);
          unit_test::for_each::
          is_const_coll<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>const>
                    (psVar6);
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x27cded);
          bVar4 = unit_test::for_each::
                  done<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>>
                            (in_stack_fffffffffffffe18,psVar1,psVar5);
          local_1c9 = bVar4 ^ 0xff;
        }
        uVar2 = local_28._8_8_;
        if ((local_1c9 & 1) == 0) break;
        local_44 = 0;
        val = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              parameters_store::all(local_8);
        psVar5 = parameters_store::all(local_8);
        unit_test::for_each::
        is_const_coll<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>const>
                  (psVar5);
        integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x27ce6a);
        local_50 = unit_test::for_each::
                   deref<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>const&,std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>>
                             (uVar2,val);
        while (((local_44 ^ 0xff) & 1) != 0) {
          shared_ptr<boost::runtime::basic_param>::shared_ptr
                    ((shared_ptr<boost::runtime::basic_param> *)in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8);
          shared_ptr<boost::runtime::basic_param>::operator->
                    ((shared_ptr<boost::runtime::basic_param> *)in_stack_fffffffffffffdc0);
          unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffffdd0,
                     in_stack_fffffffffffffdc8);
          bVar4 = arguments_store::has
                            ((arguments_store *)in_stack_fffffffffffffdd0,
                             (cstring *)in_stack_fffffffffffffdc8);
          local_20a = 1;
          if (!bVar4) {
            shared_ptr<boost::runtime::basic_param>::operator->
                      ((shared_ptr<boost::runtime::basic_param> *)in_stack_fffffffffffffdc0);
            local_20a = std::__cxx11::string::empty();
          }
          pcVar3 = local_18;
          if ((local_20a & 1) == 0) {
            shared_ptr<boost::runtime::basic_param>::operator->
                      ((shared_ptr<boost::runtime::basic_param> *)in_stack_fffffffffffffdc0);
            unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_fffffffffffffdd0,
                       in_stack_fffffffffffffdc8);
            (*pcVar3)(&local_a0,local_b0);
            if ((local_90 & 1) == 0) {
              local_88 = 7;
            }
            else {
              bVar4 = unit_test::basic_cstring<const_char>::is_empty(&local_a0);
              if (bVar4) {
                pbVar7 = shared_ptr<boost::runtime::basic_param>::operator->
                                   ((shared_ptr<boost::runtime::basic_param> *)
                                    in_stack_fffffffffffffdc0);
                this = (specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
                        *)unit_test::class_property::operator_cast_to_bool_
                                    ((class_property *)&pbVar7->p_has_optional_value);
                if (((byte)(this->super_input_error).super_param_error.super_exception & 1) == 0) {
                  shared_ptr<boost::runtime::basic_param>::operator->
                            ((shared_ptr<boost::runtime::basic_param> *)in_stack_fffffffffffffdc0);
                  unit_test::basic_cstring<const_char>::basic_cstring
                            ((basic_cstring<const_char> *)in_stack_fffffffffffffdd0,
                             in_stack_fffffffffffffdc8);
                  format_error::format_error
                            ((format_error *)in_stack_fffffffffffffdd0,
                             (cstring *)in_stack_fffffffffffffdc8);
                  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
                  operator<<(this,(char *)in_stack_fffffffffffffdd0);
                  shared_ptr<boost::runtime::basic_param>::operator->
                            ((shared_ptr<boost::runtime::basic_param> *)in_stack_fffffffffffffdc0);
                  specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::
                  operator<<((specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
                              *)in_stack_fffffffffffffe18,val);
                  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
                  operator<<(this,(char *)in_stack_fffffffffffffdd0);
                  unit_test::ut_detail::throw_exception<boost::runtime::format_error>
                            ((format_error *)in_stack_fffffffffffffdd0);
                }
              }
              in_stack_fffffffffffffdd0 =
                   shared_ptr<boost::runtime::basic_param>::operator->
                             ((shared_ptr<boost::runtime::basic_param> *)in_stack_fffffffffffffdc0);
              unit_test::basic_cstring<const_char>::basic_cstring(local_1b0,&local_a0);
              (*in_stack_fffffffffffffdd0->_vptr_basic_param[3])
                        (in_stack_fffffffffffffdd0,local_1b0,0,local_10);
              local_88 = 0;
            }
          }
          else {
            local_88 = 7;
          }
          shared_ptr<boost::runtime::basic_param>::~shared_ptr
                    ((shared_ptr<boost::runtime::basic_param> *)0x27d1ab);
          local_44 = 1;
        }
        if ((local_44 & 1) == 0) {
          parameters_store::all(local_8);
        }
        else {
          in_stack_fffffffffffffdc0 = (sp_counted_base *)local_28._8_8_;
          in_stack_fffffffffffffdc8 = (std_string *)parameters_store::all(local_8);
          psVar5 = parameters_store::all(local_8);
          unit_test::for_each::
          is_const_coll<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>const>
                    (psVar5);
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x27d227);
          unit_test::for_each::
          next<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>>
                    (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8);
        }
      }
    }
  }
  return;
}

Assistant:

inline void
fetch_absent( parameters_store const& params, runtime::arguments_store& args, ReadFunc read_func )
{
    BOOST_TEST_FOREACH( parameters_store::storage_type::value_type const&, v, params.all() ) {
        basic_param_ptr param = v.second;

        if( args.has( param->p_name ) || param->p_env_var.empty() )
            continue;

        std::pair<cstring,bool> value = read_func( param->p_env_var );

        if( !value.second )
            continue;

        // Validate against unexpected empty value
        BOOST_TEST_I_ASSRT( !value.first.is_empty() || param->p_has_optional_value,
            format_error( param->p_name ) 
                << "Missing an argument value for the parameter " << param->p_name
                << " in the environment." );

        // Produce argument value
        param->produce_argument( value.first, false, args );

    }
}